

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O0

void __thiscall QPropertyAnimationPrivate::updateMetaProperty(QPropertyAnimationPrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  parameter_type pQVar4;
  undefined4 extraout_var;
  char *pcVar5;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QObject *target;
  QMetaProperty *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  uint line;
  parameter_type this_01;
  QVariantAnimationPrivate *this_02;
  undefined4 in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff40;
  QMetaObject *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff68;
  QMessageLogger local_60;
  QObject **local_8;
  QObject *this_00;
  
  local_8 = *(QObject ***)(in_FS_OFFSET + 0x28);
  pQVar4 = QPropertyData<QObject_*>::valueBypassingBindings
                     ((QPropertyData<QObject_*> *)(in_RDI + 0x16));
  if (pQVar4 != (parameter_type)0x0) {
    QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
    ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
             *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    bVar1 = QByteArray::isEmpty((QByteArray *)0x68281d);
    if (!bVar1) {
      this_01 = pQVar4;
      QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
      ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      QByteArray::operator_cast_to_char_((QByteArray *)0x682864);
      this_02 = (QVariantAnimationPrivate *)&stack0xffffffffffffffd8;
      QObject::property(in_RDI,in_stack_ffffffffffffff68);
      iVar2 = ::QVariant::userType((QVariant *)0x682888);
      *(int *)&in_RDI[0x16].d_ptr.d = iVar2;
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      iVar3 = (**pQVar4->_vptr_QObject)();
      this_00 = (QObject *)CONCAT44(extraout_var,iVar3);
      QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
      ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      QByteArray::operator_cast_to_char_((QByteArray *)0x6828d2);
      iVar3 = QMetaObject::indexOfProperty(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      *(int *)((long)&in_RDI[0x16].d_ptr.d + 4) = iVar3;
      if (*(int *)&in_RDI[0x16].d_ptr.d != 0) {
        QVariantAnimationPrivate::convertValues(this_02,(int)((ulong)this_01 >> 0x20));
      }
      iVar3 = (int)((ulong)this_02 >> 0x20);
      if (*(int *)((long)&in_RDI[0x16].d_ptr.d + 4) == -1) {
        *(undefined4 *)&in_RDI[0x16].d_ptr.d = 0;
        QObject::dynamicPropertyNames(this_00);
        bVar1 = QListSpecialMethodsBase<QByteArray>::
                contains<QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>_>
                          ((QListSpecialMethodsBase<QByteArray> *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                            *)in_stack_ffffffffffffff08);
        line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff14) ^ 0xff000000;
        QList<QByteArray>::~QList((QList<QByteArray> *)0x68298a);
        if ((line & 0x1000000) != 0) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)this_01,(char *)this_00,line,
                     (char *)in_stack_ffffffffffffff08);
          QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
          ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                   *)CONCAT44(line,in_stack_ffffffffffffff10));
          pcVar5 = QByteArray::constData((QByteArray *)0x6829c3);
          QMessageLogger::warning
                    (&local_60,
                     "QPropertyAnimation: you\'re trying to animate a non-existing property %s of your QObject"
                     ,pcVar5);
        }
      }
      else {
        (**pQVar4->_vptr_QObject)();
        QMetaObject::property((QMetaObject *)CONCAT44(iVar2,in_stack_ffffffffffffff30),iVar3);
        bVar1 = QMetaProperty::isWritable(in_stack_ffffffffffffff08);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)this_01,(char *)this_00,in_stack_ffffffffffffff14,
                     (char *)in_stack_ffffffffffffff08);
          QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
          ::value((QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
                   *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
          pcVar5 = QByteArray::constData((QByteArray *)0x682a3e);
          QMessageLogger::warning
                    ((QMessageLogger *)&stack0xffffffffffffff60,
                     "QPropertyAnimation: you\'re trying to animate the non-writable property %s of your QObject"
                     ,pcVar5);
        }
      }
      goto LAB_00682a56;
    }
  }
  *(undefined4 *)&in_RDI[0x16].d_ptr.d = 0;
  *(undefined4 *)((long)&in_RDI[0x16].d_ptr.d + 4) = 0xffffffff;
LAB_00682a56:
  if (*(QObject ***)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyAnimationPrivate::updateMetaProperty()
{
    const QObject *target = targetObject.valueBypassingBindings();
    if (!target || propertyName.value().isEmpty()) {
        propertyType = QMetaType::UnknownType;
        propertyIndex = -1;
        return;
    }

    //propertyType will be set to a valid type only if there is a Q_PROPERTY
    //otherwise it will be set to QVariant::Invalid at the end of this function
    propertyType = target->property(propertyName.value()).userType();
    propertyIndex = target->metaObject()->indexOfProperty(propertyName.value());

    if (propertyType != QMetaType::UnknownType)
        convertValues(propertyType);
    if (propertyIndex == -1) {
        //there is no Q_PROPERTY on the object
        propertyType = QMetaType::UnknownType;
        if (!target->dynamicPropertyNames().contains(propertyName))
            qWarning("QPropertyAnimation: you're trying to animate a non-existing property %s of "
                     "your QObject",
                     propertyName.value().constData());
    } else if (!target->metaObject()->property(propertyIndex).isWritable()) {
        qWarning("QPropertyAnimation: you're trying to animate the non-writable property %s of "
                 "your QObject",
                 propertyName.value().constData());
    }
}